

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O2

void WebRates(sunrealtype x,sunrealtype y,sunrealtype t,sunrealtype *c,sunrealtype *rate,
             WebData wdata)

{
  uint uVar1;
  ulong uVar2;
  sunrealtype (*pasVar3) [6];
  ulong uVar4;
  sunrealtype *psVar5;
  long lVar6;
  
  uVar1 = wdata->ns;
  pasVar3 = wdata->acoef;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    rate[uVar4] = 0.0;
  }
  for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    psVar5 = rate;
    for (lVar6 = 0; (ulong)uVar1 * 6 - lVar6 != 0; lVar6 = lVar6 + 6) {
      *psVar5 = c[uVar4] * (*pasVar3)[lVar6] + *psVar5;
      psVar5 = psVar5 + 1;
    }
    pasVar3 = (sunrealtype (*) [6])(*pasVar3 + 1);
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    rate[uVar4] = (wdata->bcoef[uVar4] * (x * y + 1.0) + rate[uVar4]) * c[uVar4];
  }
  return;
}

Assistant:

static void WebRates(sunrealtype x, sunrealtype y, sunrealtype t,
                     sunrealtype c[], sunrealtype rate[], WebData wdata)
{
  int i, j, ns;
  sunrealtype fac, *bcoef;
  sunrealtype(*acoef)[NS];

  ns    = wdata->ns;
  acoef = wdata->acoef;
  bcoef = wdata->bcoef;

  for (i = 0; i < ns; i++) { rate[i] = ZERO; }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rate[i] += c[j] * acoef[i][j]; }
  }

  fac = ONE + ALPHA * x * y;
  for (i = 0; i < ns; i++) { rate[i] = c[i] * (bcoef[i] * fac + rate[i]); }
}